

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O2

void write_all_states(char *buff,uint states)

{
  size_t sVar1;
  uint uVar2;
  char *__src;
  uint uVar3;
  bool bVar4;
  
  *buff = '\0';
  while (uVar2 = -states & states, uVar2 != 0) {
    __src = "new";
    if (uVar2 != 1) {
      if (uVar2 == 0x8000) {
        __src = "fatal";
      }
      else if (uVar2 == 4) {
        __src = "data";
      }
      else if (uVar2 == 0x10) {
        __src = "eof";
      }
      else if (uVar2 == 0x20) {
        __src = "closed";
      }
      else if (uVar2 == 2) {
        __src = "header";
      }
      else {
        __src = "??";
      }
    }
    uVar3 = uVar2 ^ states;
    strcat(buff,__src);
    bVar4 = uVar2 != states;
    states = uVar3;
    if (bVar4) {
      sVar1 = strlen(buff);
      (buff + sVar1)[0] = '/';
      (buff + sVar1)[1] = '\0';
    }
  }
  return;
}

Assistant:

static void
write_all_states(char *buff, unsigned int states)
{
	unsigned int lowbit;

	*buff = '\0';

	/* A trick for computing the lowest set bit. */
	while ((lowbit = states & (1 + ~states)) != 0) {
		states &= ~lowbit;		/* Clear the low bit. */
		strcat(buff, state_name(lowbit));
		if (states != 0)
			strcat(buff, "/");
	}
}